

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O2

REF_STATUS ref_cell_compact(REF_CELL ref_cell,REF_INT **o2n_ptr,REF_INT **n2o_ptr)

{
  int iVar1;
  REF_INT *pRVar2;
  ulong uVar3;
  REF_INT *pRVar4;
  int iVar5;
  undefined8 uVar6;
  char *pcVar7;
  ulong uVar8;
  
  uVar8 = (ulong)ref_cell->max;
  if ((long)uVar8 < 0) {
    pcVar7 = "malloc *o2n_ptr of REF_INT negative";
    uVar6 = 0x357;
  }
  else {
    pRVar2 = (REF_INT *)malloc(uVar8 * 4);
    *o2n_ptr = pRVar2;
    if (pRVar2 == (REF_INT *)0x0) {
      pcVar7 = "malloc *o2n_ptr of REF_INT NULL";
      uVar6 = 0x357;
LAB_0018216d:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",uVar6,
             "ref_cell_compact",pcVar7);
      return 2;
    }
    for (uVar3 = 0; uVar8 != uVar3; uVar3 = uVar3 + 1) {
      pRVar2[uVar3] = -1;
    }
    iVar1 = ref_cell->n;
    if ((long)iVar1 < 0) {
      pcVar7 = "malloc *n2o_ptr of REF_INT negative";
      uVar6 = 0x359;
    }
    else {
      pRVar4 = (REF_INT *)malloc((long)iVar1 * 4);
      *n2o_ptr = pRVar4;
      if (pRVar4 == (REF_INT *)0x0) {
        pcVar7 = "malloc *n2o_ptr of REF_INT NULL";
        uVar6 = 0x359;
        goto LAB_0018216d;
      }
      iVar5 = 0;
      for (uVar3 = 0; uVar3 < uVar8; uVar3 = uVar3 + 1) {
        if (ref_cell->c2n[(long)(int)uVar3 * (long)ref_cell->size_per] != -1) {
          pRVar2[uVar3] = iVar5;
          iVar5 = iVar5 + 1;
        }
      }
      if (iVar5 == iVar1) {
        for (uVar3 = 0; uVar8 != uVar3; uVar3 = uVar3 + 1) {
          if (ref_cell->c2n[(long)(int)uVar3 * (long)ref_cell->size_per] != -1) {
            pRVar4[pRVar2[uVar3]] = (int)uVar3;
          }
        }
        return 0;
      }
      pcVar7 = "ncell miscount";
      uVar6 = 0x363;
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",uVar6,
         "ref_cell_compact",pcVar7);
  return 1;
}

Assistant:

REF_FCN REF_STATUS ref_cell_compact(REF_CELL ref_cell, REF_INT **o2n_ptr,
                                    REF_INT **n2o_ptr) {
  REF_INT cell;
  REF_INT ncell;
  REF_INT *o2n, *n2o;

  ref_malloc_init(*o2n_ptr, ref_cell_max(ref_cell), REF_INT, REF_EMPTY);
  o2n = *o2n_ptr;
  ref_malloc(*n2o_ptr, ref_cell_n(ref_cell), REF_INT);
  n2o = *n2o_ptr;

  ncell = 0;

  each_ref_cell_valid_cell(ref_cell, cell) {
    o2n[cell] = ncell;
    ncell++;
  }

  RES(ncell, ref_cell_n(ref_cell), "ncell miscount");

  each_ref_cell_valid_cell(ref_cell, cell) n2o[o2n[cell]] = cell;

  return REF_SUCCESS;
}